

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_implied_instructions.cpp
# Opt level: O0

int anon_unknown.dwarf_1b7ec4::NopImpliedFixture_nop_implied_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::NopImpliedFixture> *this_01;
  TestMetaFactoryBase<unsigned_char> *meta_factory;
  allocator<char> local_b1;
  string local_b0;
  CodeLocation local_90;
  allocator<char> local_51;
  string local_50;
  CodeLocation local_30;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_nop_implied_instructions.cpp"
             ,&local_51);
  testing::internal::CodeLocation::CodeLocation(&local_30,&local_50,0xd);
  this_01 = testing::internal::ParameterizedTestSuiteRegistry::
            GetTestSuitePatternHolder<(anonymous_namespace)::NopImpliedFixture>
                      (this_00,"NopImpliedFixture",&local_30);
  meta_factory = (TestMetaFactoryBase<unsigned_char> *)operator_new(8);
  testing::internal::TestMetaFactory<(anonymous_namespace)::NopImpliedFixture_nop_implied_Test>::
  TestMetaFactory((TestMetaFactory<(anonymous_namespace)::NopImpliedFixture_nop_implied_Test> *)
                  meta_factory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu_nop_implied_instructions.cpp"
             ,&local_b1);
  testing::internal::CodeLocation::CodeLocation(&local_90,&local_b0,0xd);
  testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopImpliedFixture>::
  AddTestPattern(this_01,"NopImpliedFixture","nop_implied",meta_factory,&local_90);
  testing::internal::CodeLocation::~CodeLocation(&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  testing::internal::CodeLocation::~CodeLocation(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return 0;
}

Assistant:

TEST_P(NopImpliedFixture, nop_implied) {
    stage_instruction(GetParam());

    step_execution(2);
    EXPECT_EQ(expected, registers);
}